

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall
QList<BuildsMetaMakefileGenerator::Build_*>::data(QList<BuildsMetaMakefileGenerator::Build_*> *this)

{
  QArrayDataPointer<BuildsMetaMakefileGenerator::Build_*> *this_00;
  Build **ppBVar1;
  QArrayDataPointer<BuildsMetaMakefileGenerator::Build_*> *in_RDI;
  
  detach((QList<BuildsMetaMakefileGenerator::Build_*> *)0x1d9c0c);
  this_00 = (QArrayDataPointer<BuildsMetaMakefileGenerator::Build_*> *)
            QArrayDataPointer<BuildsMetaMakefileGenerator::Build_*>::operator->(in_RDI);
  ppBVar1 = QArrayDataPointer<BuildsMetaMakefileGenerator::Build_*>::data(this_00);
  return ppBVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }